

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import.cc
# Opt level: O3

Type * anon_unknown.dwarf_18458::load_numeric(TypeNode *node,Factory *factory)

{
  NumericCategory NVar1;
  _Alloc_hider _Var2;
  int iVar3;
  runtime_error *this;
  unsigned_long uVar4;
  Numeric *this_00;
  char *in_RCX;
  long *plVar5;
  char *pcVar6;
  long *plVar7;
  undefined1 *local_b0 [2];
  undefined1 local_a0 [16];
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  string local_50;
  
  (anonymous_namespace)::getStringAttribute_abi_cxx11_
            (&local_50,(_anonymous_namespace_ *)node->xml,(xmlNodePtr)0x10f146,in_RCX);
  _Var2._M_p = local_50._M_dataplus._M_p;
  pcVar6 = "sint";
  plVar7 = (long *)((anonymous_namespace)::numeric_categories + 0x10);
  do {
    iVar3 = xmlStrcmp(_Var2._M_p,pcVar6);
    if (iVar3 == 0) {
      NVar1 = *(NumericCategory *)(plVar7 + -1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      uVar4 = getAttribute<unsigned_long>(node->xml,"size");
      this_00 = (Numeric *)operator_new(0x48);
      Typelib::Numeric::Numeric(this_00,(string *)&node->name,uVar4,NVar1);
      Factory::insert(factory,node,(Type *)this_00);
      return (Type *)this_00;
    }
    pcVar6 = (char *)*plVar7;
    plVar7 = plVar7 + 2;
  } while (pcVar6 != (char *)0x0);
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  local_b0[0] = local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"unrecognized XML node \'","");
  plVar7 = (long *)std::__cxx11::string::append((char *)local_b0);
  local_90 = (long *)*plVar7;
  plVar5 = plVar7 + 2;
  if (local_90 == plVar5) {
    local_80 = *plVar5;
    lStack_78 = plVar7[3];
    local_90 = &local_80;
  }
  else {
    local_80 = *plVar5;
  }
  local_88 = plVar7[1];
  *plVar7 = (long)plVar5;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_90);
  local_70 = (long *)*plVar7;
  plVar5 = plVar7 + 2;
  if (local_70 == plVar5) {
    local_60 = *plVar5;
    lStack_58 = plVar7[3];
    local_70 = &local_60;
  }
  else {
    local_60 = *plVar5;
  }
  local_68 = plVar7[1];
  *plVar7 = (long)plVar5;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  std::runtime_error::runtime_error(this,(string *)&local_70);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Type const* load_numeric(TypeNode const& node, Factory& factory)
    {
        NumericCategory category = getCategoryFromNode
            ( numeric_categories
            , reinterpret_cast<xmlChar const*>(getAttribute<string>(node.xml, "category").c_str()) );
        size_t      size = getAttribute<size_t>(node.xml, "size");

        Type* type = new Numeric(node.name, size, category.type);
        factory.insert(node, type);
        return type;
    }